

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void smooth_predictor_wxh
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column,int width,
               int height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  short sVar13;
  undefined4 uVar14;
  undefined6 uVar15;
  short sVar16;
  undefined4 uVar17;
  undefined6 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint3 uVar21;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i top_weights_x_hi;
  __m128i top_weights_x_lo;
  __m128i top_weights_x;
  __m128i weights_x;
  __m128i top_x;
  int x;
  __m128i weight_left_y;
  __m128i scaled_bottom_left;
  __m128i scale_m_weights_y;
  __m128i left_y;
  __m128i weights_y;
  int y;
  __m128i round;
  __m128i top_right;
  __m128i bottom_left;
  __m128i scale_value;
  __m128i zero;
  uint8_t *sm_weights_w;
  uint8_t *sm_weights_h;
  int local_57c;
  undefined2 uStack_564;
  undefined2 uStack_562;
  int local_51c;
  long local_490;
  byte local_478;
  byte bStack_477;
  byte bStack_476;
  byte bStack_475;
  byte bStack_474;
  byte bStack_473;
  byte bStack_472;
  byte bStack_471;
  byte local_468;
  undefined1 uStack_467;
  byte bStack_466;
  undefined1 uStack_465;
  byte bStack_464;
  undefined1 uStack_463;
  byte bStack_462;
  undefined1 uStack_461;
  short sStack_436;
  short sStack_434;
  short sStack_432;
  short sStack_42e;
  short sStack_42c;
  short sStack_42a;
  short local_428;
  ushort uStack_426;
  short sStack_424;
  ushort uStack_422;
  short sStack_420;
  ushort uStack_41e;
  short sStack_41c;
  ushort uStack_41a;
  short local_418;
  ushort uStack_416;
  short sStack_414;
  ushort uStack_412;
  short sStack_410;
  ushort uStack_40e;
  short sStack_40c;
  ushort uStack_40a;
  ushort local_308;
  ushort uStack_306;
  ushort uStack_304;
  ushort uStack_302;
  ushort uStack_300;
  ushort uStack_2fe;
  ushort uStack_2fc;
  ushort uStack_2fa;
  ushort local_2e8;
  ushort uStack_2c6;
  ushort uStack_2c4;
  ushort uStack_2c2;
  ushort uStack_2be;
  ushort uStack_2bc;
  ushort uStack_2ba;
  ushort local_2a8;
  ushort local_1e8;
  uint uStack_194;
  uint uStack_18c;
  uint uStack_174;
  uint uStack_16c;
  int iStack_154;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int iStack_134;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  __m128i pred;
  __m128i scaled_top_right_hi;
  __m128i scaled_top_right_lo;
  __m128i scaled_top_right;
  __m128i inverted_weights_x;
  __m128i pred_hi;
  __m128i pred_lo;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  
  bVar3 = *(byte *)(in_RCX + (in_R9D + -1));
  bVar4 = *(byte *)(in_RDX + (in_R8D + -1));
  local_490 = in_RDI;
  for (local_51c = 0; local_51c < in_R9D; local_51c = local_51c + 1) {
    local_2e8 = (ushort)"\x02\x03\x04\x05\x03\x04\x05\x06\x04\x05\x06\a\x05\x06\a\b\x02\x03\x04\x05\x03\x04\x05\x06\x04\x05\x06\a\x05\x06\a\b"
                        [(long)local_51c + (long)in_R9D + 0x1c];
    local_2a8 = (ushort)bVar3;
    local_1e8 = (ushort)"\x02\x03\x04\x05\x03\x04\x05\x06\x04\x05\x06\a\x05\x06\a\b\x02\x03\x04\x05\x03\x04\x05\x06\x04\x05\x06\a\x05\x06\a\b"
                        [(long)local_51c + (long)in_R9D + 0x1c];
    uVar21 = CONCAT12(*(undefined1 *)(in_RCX + local_51c),local_1e8);
    uVar22 = CONCAT13(0,uVar21);
    iVar23 = (ushort)((0x100 - local_2e8) * local_2a8) + 0x100;
    uStack_564 = (undefined2)iVar23;
    uStack_562 = (undefined2)((uint)iVar23 >> 0x10);
    for (local_57c = 0; local_57c < in_R8D; local_57c = local_57c + 8) {
      uVar1 = *(undefined8 *)(in_RDX + local_57c);
      uVar2 = *(undefined8 *)
               (
               "\x02\x03\x04\x05\x03\x04\x05\x06\x04\x05\x06\a\x05\x06\a\b\x02\x03\x04\x05\x03\x04\x05\x06\x04\x05\x06\a\x05\x06\a\b"
               + (long)local_57c + (long)in_R8D + 0x1c);
      local_468 = (byte)uVar1;
      uStack_467 = (undefined1)((ulong)uVar1 >> 8);
      bStack_466 = (byte)((ulong)uVar1 >> 0x10);
      uStack_465 = (undefined1)((ulong)uVar1 >> 0x18);
      bStack_464 = (byte)((ulong)uVar1 >> 0x20);
      uStack_463 = (undefined1)((ulong)uVar1 >> 0x28);
      bStack_462 = (byte)((ulong)uVar1 >> 0x30);
      uStack_461 = (undefined1)((ulong)uVar1 >> 0x38);
      local_478 = (byte)uVar2;
      bStack_477 = (byte)((ulong)uVar2 >> 8);
      bStack_476 = (byte)((ulong)uVar2 >> 0x10);
      bStack_475 = (byte)((ulong)uVar2 >> 0x18);
      bStack_474 = (byte)((ulong)uVar2 >> 0x20);
      bStack_473 = (byte)((ulong)uVar2 >> 0x28);
      bStack_472 = (byte)((ulong)uVar2 >> 0x30);
      bStack_471 = (byte)((ulong)uVar2 >> 0x38);
      auVar20[1] = 0;
      auVar20[0] = local_468;
      auVar20[2] = local_478;
      auVar20[3] = 0;
      auVar20[4] = uStack_467;
      auVar20[5] = 0;
      auVar20[6] = bStack_477;
      auVar20[7] = 0;
      auVar20[9] = 0;
      auVar20[8] = bStack_466;
      auVar20[10] = bStack_476;
      auVar20[0xb] = 0;
      auVar20[0xc] = uStack_465;
      auVar20[0xd] = 0;
      auVar20[0xe] = bStack_475;
      auVar28._4_3_ = uVar21;
      auVar28._0_4_ = uVar22;
      auVar28[7] = 0;
      auVar28._12_3_ = uVar21;
      auVar28._8_4_ = uVar22;
      auVar20[0xf] = 0;
      auVar28[0xf] = 0;
      auVar28 = pmaddwd(auVar20,auVar28);
      auVar19[1] = 0;
      auVar19[0] = bStack_464;
      auVar19[2] = bStack_474;
      auVar19[3] = 0;
      auVar19[4] = uStack_463;
      auVar19[5] = 0;
      auVar19[6] = bStack_473;
      auVar19[7] = 0;
      auVar19[9] = 0;
      auVar19[8] = bStack_462;
      auVar19[10] = bStack_472;
      auVar19[0xb] = 0;
      auVar19[0xc] = uStack_461;
      auVar19[0xd] = 0;
      auVar19[0xe] = bStack_471;
      auVar29._4_3_ = uVar21;
      auVar29._0_4_ = uVar22;
      auVar29[7] = 0;
      auVar29._12_3_ = uVar21;
      auVar29._8_4_ = uVar22;
      auVar19[0xf] = 0;
      auVar29[0xf] = 0;
      auVar29 = pmaddwd(auVar19,auVar29);
      local_308 = (ushort)local_478;
      uStack_306 = (ushort)bStack_477;
      uStack_304 = (ushort)bStack_476;
      uStack_302 = (ushort)bStack_475;
      uStack_300 = (ushort)bStack_474;
      uStack_2fe = (ushort)bStack_473;
      uStack_2fc = (ushort)bStack_472;
      uStack_2fa = (ushort)bStack_471;
      uStack_2c6 = (ushort)bVar4;
      uStack_2c4 = (ushort)bVar4;
      uStack_2c2 = (ushort)bVar4;
      uStack_2be = (ushort)bVar4;
      uStack_2bc = (ushort)bVar4;
      uStack_2ba = (ushort)bVar4;
      local_128 = auVar28._0_4_;
      iStack_124 = auVar28._4_4_;
      iStack_120 = auVar28._8_4_;
      iStack_11c = auVar28._12_4_;
      iStack_134 = (int)(CONCAT26(uStack_562,CONCAT24(uStack_564,iVar23)) >> 0x20);
      iStack_12c = (int)(CONCAT26(uStack_562,CONCAT24(uStack_564,iVar23)) >> 0x20);
      local_148 = auVar29._0_4_;
      iStack_144 = auVar29._4_4_;
      iStack_140 = auVar29._8_4_;
      iStack_13c = auVar29._12_4_;
      iStack_154 = (int)(CONCAT26(uStack_562,CONCAT24(uStack_564,iVar23)) >> 0x20);
      iStack_14c = (int)(CONCAT26(uStack_562,CONCAT24(uStack_564,iVar23)) >> 0x20);
      uStack_174 = (uint)(ushort)((0x100 - uStack_306) * uStack_2c6);
      uStack_16c = (uint)(ushort)((0x100 - uStack_302) * uStack_2c2);
      uVar24 = local_128 + iVar23 + (uint)(ushort)((0x100 - local_308) * (ushort)bVar4);
      uStack_174 = iStack_124 + iStack_134 + uStack_174;
      uVar26 = iStack_120 + iVar23 + (uint)(ushort)((0x100 - uStack_304) * uStack_2c4);
      uStack_16c = iStack_11c + iStack_12c + uStack_16c;
      uStack_194 = (uint)(ushort)((0x100 - uStack_2fe) * uStack_2be);
      uStack_18c = (uint)(ushort)((0x100 - uStack_2fa) * uStack_2ba);
      uVar25 = local_148 + iVar23 + (uint)(ushort)((0x100 - uStack_300) * (ushort)bVar4);
      uStack_194 = iStack_144 + iStack_154 + uStack_194;
      uVar27 = iStack_140 + iVar23 + (uint)(ushort)((0x100 - uStack_2fc) * uStack_2bc);
      uStack_18c = iStack_13c + iStack_14c + uStack_18c;
      local_418 = (short)(uVar24 >> 9);
      uStack_416 = (ushort)(uVar24 >> 0x19);
      sStack_414 = (short)(uStack_174 >> 9);
      uStack_412 = (ushort)(uStack_174 >> 0x19);
      sStack_410 = (short)(uVar26 >> 9);
      uStack_40e = (ushort)(uVar26 >> 0x19);
      sStack_40c = (short)(uStack_16c >> 9);
      uStack_40a = (ushort)(uStack_16c >> 0x19);
      local_428 = (short)(uVar25 >> 9);
      uStack_426 = (ushort)(uVar25 >> 0x19);
      sStack_424 = (short)(uStack_194 >> 9);
      uStack_422 = (ushort)(uStack_194 >> 0x19);
      sStack_420 = (short)(uVar27 >> 9);
      uStack_41e = (ushort)(uVar27 >> 0x19);
      sStack_41c = (short)(uStack_18c >> 9);
      uStack_41a = (ushort)(uStack_18c >> 0x19);
      cVar5 = (0 < local_418) * (local_418 < 0x100) * (char)(uVar24 >> 9) - (0xff < local_418);
      cVar6 = (0 < sStack_414) * (sStack_414 < 0x100) * (char)(uStack_174 >> 9) -
              (0xff < sStack_414);
      cVar7 = (0 < sStack_410) * (sStack_410 < 0x100) * (char)(uVar26 >> 9) - (0xff < sStack_410);
      cVar8 = (0 < sStack_40c) * (sStack_40c < 0x100) * (char)(uStack_16c >> 9) -
              (0xff < sStack_40c);
      cVar9 = (0 < local_428) * (local_428 < 0x100) * (char)(uVar25 >> 9) - (0xff < local_428);
      cVar10 = (0 < sStack_424) * (sStack_424 < 0x100) * (char)(uStack_194 >> 9) -
               (0xff < sStack_424);
      cVar11 = (0 < sStack_420) * (sStack_420 < 0x100) * (char)(uVar27 >> 9) - (0xff < sStack_420);
      cVar12 = (0 < sStack_41c) * (sStack_41c < 0x100) * (char)(uStack_18c >> 9) -
               (0xff < sStack_41c);
      sVar13 = CONCAT11((uStack_416 != 0) * (uStack_416 < 0x100) * (byte)(uVar24 >> 0x19) -
                        (0xff < uStack_416),cVar5);
      uVar14 = CONCAT13((uStack_412 != 0) * (uStack_412 < 0x100) * (byte)(uStack_174 >> 0x19) -
                        (0xff < uStack_412),CONCAT12(cVar6,sVar13));
      uVar15 = CONCAT15((uStack_40e != 0) * (uStack_40e < 0x100) * (byte)(uVar26 >> 0x19) -
                        (0xff < uStack_40e),CONCAT14(cVar7,uVar14));
      sVar16 = CONCAT11((uStack_426 != 0) * (uStack_426 < 0x100) * (byte)(uVar25 >> 0x19) -
                        (0xff < uStack_426),cVar9);
      uVar17 = CONCAT13((uStack_422 != 0) * (uStack_422 < 0x100) * (byte)(uStack_194 >> 0x19) -
                        (0xff < uStack_422),CONCAT12(cVar10,sVar16));
      uVar18 = CONCAT15((uStack_41e != 0) * (uStack_41e < 0x100) * (byte)(uVar27 >> 0x19) -
                        (0xff < uStack_41e),CONCAT14(cVar11,uVar17));
      sStack_436 = (short)((uint)uVar14 >> 0x10);
      sStack_434 = (short)((uint6)uVar15 >> 0x20);
      sStack_432 = (short)(CONCAT17((uStack_40a != 0) * (uStack_40a < 0x100) *
                                    (byte)(uStack_16c >> 0x19) - (0xff < uStack_40a),
                                    CONCAT16(cVar8,uVar15)) >> 0x30);
      sStack_42e = (short)((uint)uVar17 >> 0x10);
      sStack_42c = (short)((uint6)uVar18 >> 0x20);
      sStack_42a = (short)(CONCAT17((uStack_41a != 0) * (uStack_41a < 0x100) *
                                    (byte)(uStack_18c >> 0x19) - (0xff < uStack_41a),
                                    CONCAT16(cVar12,uVar18)) >> 0x30);
      *(ulong *)(local_490 + local_57c) =
           CONCAT17((0 < sStack_42a) * (sStack_42a < 0x100) * cVar12 - (0xff < sStack_42a),
                    CONCAT16((0 < sStack_42c) * (sStack_42c < 0x100) * cVar11 - (0xff < sStack_42c),
                             CONCAT15((0 < sStack_42e) * (sStack_42e < 0x100) * cVar10 -
                                      (0xff < sStack_42e),
                                      CONCAT14((0 < sVar16) * (sVar16 < 0x100) * cVar9 -
                                               (0xff < sVar16),
                                               CONCAT13((0 < sStack_432) * (sStack_432 < 0x100) *
                                                        cVar8 - (0xff < sStack_432),
                                                        CONCAT12((0 < sStack_434) *
                                                                 (sStack_434 < 0x100) * cVar7 -
                                                                 (0xff < sStack_434),
                                                                 CONCAT11((0 < sStack_436) *
                                                                          (sStack_436 < 0x100) *
                                                                          cVar6 - (0xff < sStack_436
                                                                                  ),
                                                                          (0 < sVar13) *
                                                                          (sVar13 < 0x100) * cVar5 -
                                                                          (0xff < sVar13))))))));
    }
    local_490 = in_RSI + local_490;
  }
  return;
}

Assistant:

static void smooth_predictor_wxh(uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
                                 const uint8_t *LIBAOM_RESTRICT top_row,
                                 const uint8_t *LIBAOM_RESTRICT left_column,
                                 int width, int height) {
  const uint8_t *const sm_weights_h = smooth_weights + height - 4;
  const uint8_t *const sm_weights_w = smooth_weights + width - 4;
  const __m128i zero = _mm_setzero_si128();
  const __m128i scale_value = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i bottom_left = _mm_cvtsi32_si128(left_column[height - 1]);
  const __m128i top_right = _mm_set1_epi16(top_row[width - 1]);
  const __m128i round = _mm_set1_epi32(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  for (int y = 0; y < height; ++y) {
    const __m128i weights_y = _mm_cvtsi32_si128(sm_weights_h[y]);
    const __m128i left_y = _mm_cvtsi32_si128(left_column[y]);
    const __m128i scale_m_weights_y = _mm_sub_epi16(scale_value, weights_y);
    __m128i scaled_bottom_left =
        _mm_mullo_epi16(scale_m_weights_y, bottom_left);
    const __m128i weight_left_y =
        _mm_shuffle_epi32(_mm_unpacklo_epi16(weights_y, left_y), 0);
    scaled_bottom_left = _mm_add_epi32(scaled_bottom_left, round);
    scaled_bottom_left = _mm_shuffle_epi32(scaled_bottom_left, 0);
    for (int x = 0; x < width; x += 8) {
      const __m128i top_x = LoadLo8(top_row + x);
      const __m128i weights_x = LoadLo8(sm_weights_w + x);
      const __m128i top_weights_x = _mm_unpacklo_epi8(top_x, weights_x);
      const __m128i top_weights_x_lo = cvtepu8_epi16(top_weights_x);
      const __m128i top_weights_x_hi = _mm_unpackhi_epi8(top_weights_x, zero);

      // Here opposite weights and pixels are multiplied, where the order of
      // interleaving is indicated in the names.
      __m128i pred_lo = _mm_madd_epi16(top_weights_x_lo, weight_left_y);
      __m128i pred_hi = _mm_madd_epi16(top_weights_x_hi, weight_left_y);

      // |scaled_bottom_left| is always scaled by the same weight each row, so
      // we only derive |scaled_top_right| values here.
      const __m128i inverted_weights_x =
          _mm_sub_epi16(scale_value, cvtepu8_epi16(weights_x));
      const __m128i scaled_top_right =
          _mm_mullo_epi16(inverted_weights_x, top_right);
      const __m128i scaled_top_right_lo = cvtepu16_epi32(scaled_top_right);
      const __m128i scaled_top_right_hi =
          _mm_unpackhi_epi16(scaled_top_right, zero);
      pred_lo = _mm_add_epi32(pred_lo, scaled_bottom_left);
      pred_hi = _mm_add_epi32(pred_hi, scaled_bottom_left);
      pred_lo = _mm_add_epi32(pred_lo, scaled_top_right_lo);
      pred_hi = _mm_add_epi32(pred_hi, scaled_top_right_hi);

      // The round value for RightShiftWithRounding was added with
      // |scaled_bottom_left|.
      pred_lo = _mm_srli_epi32(pred_lo, (1 + SMOOTH_WEIGHT_LOG2_SCALE));
      pred_hi = _mm_srli_epi32(pred_hi, (1 + SMOOTH_WEIGHT_LOG2_SCALE));
      const __m128i pred = _mm_packus_epi16(pred_lo, pred_hi);
      StoreLo8(dst + x, _mm_packus_epi16(pred, pred));
    }
    dst += stride;
  }
}